

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_pretailcall(lua_State *L,CallInfo *ci,StkId func,int narg1,int delta)

{
  byte bVar1;
  long lVar2;
  StkId pSVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  lua_CFunction f;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 *puVar10;
  
  uVar7 = (ulong)narg1;
  uVar9 = uVar7 << 4 | 8;
  while( true ) {
    bVar5 = (func->val).tt_ & 0x3f;
    if (bVar5 == 6) {
      lVar2 = *(long *)((func->val).value_.f + 0x18);
      bVar5 = *(byte *)(lVar2 + 0xc);
      bVar1 = *(byte *)(lVar2 + 10);
      lVar8 = (ulong)bVar5 - (long)delta;
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= lVar8) {
        lVar4 = (L->stack).offset;
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
        luaD_growstack(L,(int)lVar8,1);
        func = (StkId)(((long)func - lVar4) + (long)(L->stack).p);
      }
      (ci->func).p = (ci->func).p + -(long)delta;
      if (0 < (int)uVar7) {
        lVar8 = 0;
        do {
          pSVar3 = (ci->func).p;
          *(undefined8 *)((long)pSVar3 + lVar8) = *(undefined8 *)((long)func + lVar8);
          *(undefined1 *)((long)pSVar3 + lVar8 + 8) = *(undefined1 *)((long)func + lVar8 + 8);
          lVar8 = lVar8 + 0x10;
        } while ((uVar7 & 0xffffffff) << 4 != lVar8);
      }
      pSVar3 = (ci->func).p;
      if ((int)uVar7 <= (int)(uint)bVar1) {
        lVar8 = uVar7 - 1;
        puVar10 = (undefined1 *)(uVar9 + (long)pSVar3);
        do {
          *puVar10 = 0;
          lVar8 = lVar8 + 1;
          puVar10 = puVar10 + 0x10;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (lVar8 < (long)(ulong)(uint)bVar1);
      }
      (ci->top).p = pSVar3 + (ulong)bVar5 + 1;
      (ci->u).l.savedpc = *(Instruction **)(lVar2 + 0x40);
      *(byte *)&ci->callstatus = (byte)ci->callstatus | 0x20;
      (L->top).p = pSVar3 + (uVar7 & 0xffffffff);
      return -1;
    }
    if (bVar5 == 0x16) break;
    if (bVar5 == 0x26) {
      f = *(lua_CFunction *)((func->val).value_.f + 0x18);
      goto LAB_00108495;
    }
    func = tryfuncTM(L,func);
    uVar7 = uVar7 + 1;
    uVar9 = uVar9 + 0x10;
  }
  f = (func->val).value_.f;
LAB_00108495:
  iVar6 = precallC(L,func,-1,f);
  return iVar6;
}

Assistant:

int luaD_pretailcall (lua_State *L, CallInfo *ci, StkId func,
                                    int narg1, int delta) {
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      return precallC(L, func, LUA_MULTRET, clCvalue(s2v(func))->f);
    case LUA_VLCF:  /* light C function */
      return precallC(L, func, LUA_MULTRET, fvalue(s2v(func)));
    case LUA_VLCL: {  /* Lua function */
      Proto *p = clLvalue(s2v(func))->p;
      int fsize = p->maxstacksize;  /* frame size */
      int nfixparams = p->numparams;
      int i;
      checkstackGCp(L, fsize - delta, func);
      ci->func.p -= delta;  /* restore 'func' (if vararg) */
      for (i = 0; i < narg1; i++)  /* move down function and arguments */
        setobjs2s(L, ci->func.p + i, func + i);
      func = ci->func.p;  /* moved-down function */
      for (; narg1 <= nfixparams; narg1++)
        setnilvalue(s2v(func + narg1));  /* complete missing arguments */
      ci->top.p = func + 1 + fsize;  /* top for new function */
      lua_assert(ci->top.p <= L->stack_last.p);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus |= CIST_TAIL;
      L->top.p = func + narg1;  /* set top */
      return -1;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* try to get '__call' metamethod */
      /* return luaD_pretailcall(L, ci, func, narg1 + 1, delta); */
      narg1++;
      goto retry;  /* try again */
    }
  }
}